

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageHsv.cpp
# Opt level: O2

void __thiscall AlgorithmAreaAverageHsv::Iterate(AlgorithmAreaAverageHsv *this)

{
  QImage *image;
  QImage *image_00;
  qulonglong *pqVar1;
  int iVar2;
  int iVar3;
  QRgb a;
  QRgb a_00;
  QRgb b;
  QRgb b_00;
  QRgb index_or_rgb;
  QRgb index_or_rgb_00;
  QRgb a_01;
  QRgb a_02;
  int iVar4;
  int iVar5;
  int iVar6;
  qulonglong _t1;
  AlgorithmAreaAverageHsv *this_00;
  QImage *this_01;
  bool bVar7;
  QPoint bLoc;
  QPoint aLoc;
  
  image = &(this->super_AlgorithmBase).allRgb_;
  image_00 = &(this->super_AlgorithmBase).target_;
  iVar2 = 100000;
  while( true ) {
    bVar7 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar7) break;
    iVar3 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    aLoc.yp = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    aLoc.xp = iVar3;
    iVar3 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    this_00 = this;
    bLoc.yp = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    bLoc.xp = iVar3;
    a = GetAverageColourInArea(this_00,image,&aLoc,3);
    a_00 = GetAverageColourInArea(this_00,image,&bLoc,3);
    b = GetAverageColourInArea(this_00,image_00,&aLoc,3);
    b_00 = GetAverageColourInArea(this_00,image_00,&bLoc,3);
    index_or_rgb = QImage::pixel(image,&aLoc);
    index_or_rgb_00 = QImage::pixel(image,&bLoc);
    QImage::setPixel(image,&aLoc,index_or_rgb_00);
    this_01 = image;
    QImage::setPixel(image,&bLoc,index_or_rgb);
    a_01 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_01,image,&aLoc,3);
    a_02 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_01,image,&bLoc,3);
    iVar3 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,b);
    iVar4 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,b_00);
    iVar5 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,b);
    iVar6 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_02,b_00);
    if (iVar6 + iVar5 < iVar4 + iVar3) {
      pqVar1 = &(this->super_AlgorithmBase).improvements_;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      QImage::setPixel(image,&aLoc,index_or_rgb);
      QImage::setPixel(image,&bLoc,index_or_rgb_00);
    }
  }
  _t1 = (this->super_AlgorithmBase).iterations_ + 100000;
  (this->super_AlgorithmBase).iterations_ = _t1;
  AlgorithmBase::onIterationsChanged(&this->super_AlgorithmBase,_t1);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmAreaAverageHsv::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        const int areaSize = 3;
        QRgb hsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb hsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);
        QRgb targetA = GetAverageColourInArea(target_, aLoc, areaSize);
        QRgb targetB = GetAverageColourInArea(target_, bLoc, areaSize);

        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);
        allRgb_.setPixel(aLoc, b);
        allRgb_.setPixel(bLoc, a);
        QRgb swappedHsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb swappedHsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);

        int aDifference = ColourDifference(hsvA, targetA);
        int bDifference = ColourDifference(hsvB, targetB);

        int aSwappedDifference = ColourDifference(swappedHsvA, targetA);
        int bSwappedDifference = ColourDifference(swappedHsvB, targetB);

       if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
           // Already swapped the pixels!
           ++improvements_;
       } else {
           // Swap back if we need to
           allRgb_.setPixel(aLoc, a);
           allRgb_.setPixel(bLoc, b);
       }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}